

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidEmbeddingBias(void)

{
  pointer pcVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  Type *pTVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  WeightParams *this_02;
  ostream *poVar7;
  int iVar8;
  int iVar9;
  Result res;
  Model m1;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_58.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar6 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  iVar8 = (pAVar6->shape_).current_size_;
  if (iVar8 == (pAVar6->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar6->shape_,iVar8 + 1);
    iVar8 = (pAVar6->shape_).current_size_;
  }
  (pAVar6->shape_).current_size_ = iVar8 + 1;
  ((pAVar6->shape_).rep_)->elements[iVar8] = 1;
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_58.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  if (local_58._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_58.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_58.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  if (this_00->_oneof_case_[0] == 0x96) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x96;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::EmbeddingLayerParams::EmbeddingLayerParams(this_01.embedding_);
    (this_00->layer_).embedding_ = (EmbeddingLayerParams *)this_01;
  }
  (this_01.innerproduct_)->inputchannels_ = 5;
  (this_01.innerproduct_)->outputchannels_ = 3;
  (this_01.innerproduct_)->hasbias_ = true;
  iVar8 = 0xf;
  do {
    this_02 = (WeightParams *)((this_01.activation_)->NonlinearityType_).relu_;
    if (this_02 == (WeightParams *)0x0) {
      this_02 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(this_02);
      ((this_01.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)this_02;
    }
    iVar9 = (this_02->floatvalue_).current_size_;
    if (iVar9 == (this_02->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&this_02->floatvalue_,iVar9 + 1);
      iVar9 = (this_02->floatvalue_).current_size_;
    }
    (this_02->floatvalue_).current_size_ = iVar9 + 1;
    ((this_02->floatvalue_).rep_)->elements[iVar9] = 1.0;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  CoreML::validate<(MLModelType)500>((Result *)local_80,&local_58);
  bVar2 = CoreML::Result::good((Result *)local_80);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xade);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return (uint)bVar2;
}

Assistant:

int testInvalidEmbeddingBias() {

    Specification::Model m1;

    int num_inputs = 5;
    int num_outputs = 3;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *embeddingLayer = nn->add_layers();
    embeddingLayer->add_input("input");
    embeddingLayer->add_output("probs");
    auto *params = embeddingLayer->mutable_embedding();
    params->set_inputdim(num_inputs);
    params->set_outputchannels(num_outputs);

    params->set_hasbias(true);

    for (int i = 0; i < num_inputs * num_outputs; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Not specifying the right number of bias weights should be invalid

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}